

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmInstallTargetGenerator::GenerateScriptForConfig
          (cmInstallTargetGenerator *this,ostream *os,string *config,Indent indent)

{
  cmGeneratorTarget *this_00;
  cmMakefile *this_01;
  bool bVar1;
  bool bVar2;
  cmInstallType cVar3;
  cmLocalGenerator *pcVar4;
  string *psVar5;
  char *__assertion;
  uint uVar6;
  string *pdbName;
  cmInstallType local_260;
  string to1;
  string from1;
  string targetNameImportLib;
  string targetName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filesTo;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filesFrom;
  string fromDirConfig;
  string toDir;
  string targetNameReal;
  string targetNameSO;
  string targetNamePDB;
  string toSOName;
  string targetNameImport;
  string literal_args;
  string fromRealName;
  string toRealName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  TweakMethod tweak;
  
  cVar3 = cmGeneratorTarget::GetType(this->Target);
  switch(cVar3) {
  case cmInstallType_STATIC_LIBRARY:
  case cmInstallType_SHARED_LIBRARY:
  case cmInstallType_MODULE_LIBRARY:
    local_260 = cVar3;
    break;
  case cmInstallType_FILES:
    GenerateScriptForConfigObjectLibrary(this,os,config,indent);
    return;
  case cmInstallType_PROGRAMS:
  case cmInstallType_DIRECTORY:
  case 8:
    pcVar4 = cmGeneratorTarget::GetLocalGenerator(this->Target);
    std::__cxx11::string::string
              ((string *)&fromDirConfig,
               "cmInstallTargetGenerator created with non-installable target.",(allocator *)&toDir);
    cmLocalGenerator::IssueMessage(pcVar4,INTERNAL_ERROR,&fromDirConfig);
    goto LAB_003e46cb;
  case cmInstallType_DIRECTORY|cmInstallType_STATIC_LIBRARY:
    __assertion = "false && \"INTERFACE_LIBRARY targets have no installable outputs.\"";
    uVar6 = 0x52;
    goto LAB_003e4758;
  default:
    local_260 = cmInstallType_EXECUTABLE;
  }
  fromDirConfig._M_dataplus._M_p = (pointer)&fromDirConfig.field_2;
  fromDirConfig._M_string_length = 0;
  fromDirConfig.field_2._M_local_buf[0] = '\0';
  bVar1 = cmGeneratorTarget::NeedRelinkBeforeInstall(this->Target,config);
  if (bVar1) {
    pcVar4 = cmGeneratorTarget::GetLocalGenerator(this->Target);
    cmLocalGenerator::GetCurrentBinaryDirectory(pcVar4);
    std::__cxx11::string::assign((char *)&fromDirConfig);
    std::__cxx11::string::append((char *)&fromDirConfig);
    std::__cxx11::string::append((char *)&fromDirConfig);
  }
  else {
    cmGeneratorTarget::GetDirectory(&toDir,this->Target,config,(uint)this->ImportLibrary);
    std::__cxx11::string::operator=((string *)&fromDirConfig,(string *)&toDir);
    std::__cxx11::string::~string((string *)&toDir);
    std::__cxx11::string::append((char *)&fromDirConfig);
  }
  GetDestination(&literal_args,this,config);
  cmInstallGenerator::ConvertToAbsoluteDestination
            (&toDir,&this->super_cmInstallGenerator,&literal_args);
  std::__cxx11::string::~string((string *)&literal_args);
  std::__cxx11::string::append((char *)&toDir);
  filesFrom.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  filesTo.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  literal_args._M_dataplus._M_p = (pointer)&literal_args.field_2;
  literal_args._M_string_length = 0;
  filesFrom.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  filesFrom.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  filesTo.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  filesTo.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  literal_args.field_2._M_local_buf[0] = '\0';
  if (cVar3 == cmInstallType_EXECUTABLE) {
    if (this->NamelinkMode != NamelinkModeNone) {
      __assertion = "this->NamelinkMode == NamelinkModeNone";
      uVar6 = 0x7c;
LAB_003e4758:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmInstallTargetGenerator.cxx"
                    ,uVar6,
                    "virtual void cmInstallTargetGenerator::GenerateScriptForConfig(std::ostream &, const std::string &, Indent)"
                   );
    }
    targetName._M_dataplus._M_p = (pointer)&targetName.field_2;
    targetName._M_string_length = 0;
    targetNameSO._M_dataplus._M_p = (pointer)&targetNameSO.field_2;
    targetNameSO._M_string_length = 0;
    targetName.field_2._M_local_buf[0] = '\0';
    targetNameReal._M_dataplus._M_p = (pointer)&targetNameReal.field_2;
    targetNameReal._M_string_length = 0;
    targetNameImport._M_dataplus._M_p = (pointer)&targetNameImport.field_2;
    targetNameImport._M_string_length = 0;
    targetNameSO.field_2._M_local_buf[0] = '\0';
    targetNameReal.field_2._M_local_buf[0] = '\0';
    targetNameImport.field_2._M_local_buf[0] = '\0';
    pdbName = config;
    cmGeneratorTarget::GetExecutableNames
              (this->Target,&targetName,&targetNameSO,&targetNameReal,&targetNameImport,config);
    if (this->ImportLibrary != true) {
      std::operator+(&targetNamePDB,&fromDirConfig,&targetName);
      std::operator+(&from1,&toDir,&targetName);
      bVar1 = cmGeneratorTarget::IsAppBundleOnApple(this->Target);
      if (bVar1) {
        this_00 = this->Target;
        this_01 = this_00->Target->Makefile;
        std::__cxx11::string::string
                  ((string *)&to1,"BUNDLE_EXTENSION",(allocator *)&targetNameImportLib);
        cmGeneratorTarget::GetProperty(this_00,&to1);
        std::__cxx11::string::~string((string *)&to1);
        std::__cxx11::string::append((char *)&literal_args);
        std::__cxx11::string::append((char *)&targetNamePDB);
        std::__cxx11::string::append((char *)&targetNamePDB);
        std::__cxx11::string::append((char *)&from1);
        std::__cxx11::string::append((char *)&from1);
        std::__cxx11::string::append((char *)&from1);
        bVar1 = cmMakefile::PlatformIsAppleIos(this_01);
        if (!bVar1) {
          std::__cxx11::string::append((char *)&from1);
        }
        std::__cxx11::string::append((string *)&from1);
        local_260 = cmInstallType_DIRECTORY;
      }
      else {
        bVar1 = std::operator!=(&targetNameSO,&targetName);
        if (bVar1) {
          std::operator+(&to1,&fromDirConfig,&targetNameSO);
          psVar5 = (string *)std::__cxx11::string::append((string *)&toDir);
          std::__cxx11::string::string((string *)&targetNameImportLib,psVar5);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&filesFrom,&to1);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&filesTo,&targetNameImportLib);
          std::__cxx11::string::~string((string *)&targetNameImportLib);
          std::__cxx11::string::~string((string *)&to1);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&filesFrom,&targetNamePDB);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&filesTo,&from1);
LAB_003e451d:
      std::__cxx11::string::~string((string *)&from1);
      goto LAB_003e4527;
    }
    std::operator+(&targetNamePDB,&fromDirConfig,&targetNameReal);
    std::operator+(&from1,&toDir,&targetNameReal);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&filesFrom,&targetNamePDB);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&filesTo,&from1);
    to1._M_dataplus._M_p = (pointer)&to1.field_2;
    to1._M_string_length = 0;
    to1.field_2._M_local_buf[0] = '\0';
    bVar1 = cmGeneratorTarget::GetImplibGNUtoMS(this->Target,&targetNameReal,&to1,(char *)0x0);
    if (bVar1) {
      std::operator+(&targetNameImportLib,&fromDirConfig,&to1);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&filesFrom,
                 &targetNameImportLib);
      std::__cxx11::string::~string((string *)&targetNameImportLib);
      std::operator+(&targetNameImportLib,&toDir,&to1);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&filesTo,
                 &targetNameImportLib);
      std::__cxx11::string::~string((string *)&targetNameImportLib);
    }
    std::__cxx11::string::~string((string *)&to1);
    std::__cxx11::string::~string((string *)&from1);
    std::__cxx11::string::~string((string *)&targetNamePDB);
    local_260 = cmInstallType_STATIC_LIBRARY;
  }
  else {
    targetName._M_dataplus._M_p = (pointer)&targetName.field_2;
    targetName._M_string_length = 0;
    targetNameSO._M_dataplus._M_p = (pointer)&targetNameSO.field_2;
    targetNameSO._M_string_length = 0;
    targetNameReal._M_dataplus._M_p = (pointer)&targetNameReal.field_2;
    targetNameReal._M_string_length = 0;
    targetName.field_2._M_local_buf[0] = '\0';
    targetNameSO.field_2._M_local_buf[0] = '\0';
    targetNameImport._M_dataplus._M_p = (pointer)&targetNameImport.field_2;
    targetNameImport._M_string_length = 0;
    targetNamePDB._M_dataplus._M_p = (pointer)&targetNamePDB.field_2;
    targetNamePDB._M_string_length = 0;
    targetNameReal.field_2._M_local_buf[0] = '\0';
    targetNameImport.field_2._M_local_buf[0] = '\0';
    targetNamePDB.field_2._M_local_buf[0] = '\0';
    pdbName = &targetNamePDB;
    cmGeneratorTarget::GetLibraryNames
              (this->Target,&targetName,&targetNameSO,&targetNameReal,&targetNameImport,pdbName,
               config);
    if (this->ImportLibrary == true) {
      if (this->NamelinkMode != NamelinkModeNone) {
        __assert_fail("this->NamelinkMode == NamelinkModeNone",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmInstallTargetGenerator.cxx"
                      ,0xc5,
                      "virtual void cmInstallTargetGenerator::GenerateScriptForConfig(std::ostream &, const std::string &, Indent)"
                     );
      }
      std::operator+(&from1,&fromDirConfig,&targetNameImport);
      std::operator+(&to1,&toDir,&targetNameImport);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&filesFrom,&from1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&filesTo,&to1);
      targetNameImportLib._M_dataplus._M_p = (pointer)&targetNameImportLib.field_2;
      targetNameImportLib._M_string_length = 0;
      targetNameImportLib.field_2._M_local_buf[0] = '\0';
      bVar1 = cmGeneratorTarget::GetImplibGNUtoMS
                        (this->Target,&targetNameImport,&targetNameImportLib,(char *)0x0);
      if (bVar1) {
        std::operator+(&toSOName,&fromDirConfig,&targetNameImportLib);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&filesFrom,
                   &toSOName);
        std::__cxx11::string::~string((string *)&toSOName);
        std::operator+(&toSOName,&toDir,&targetNameImportLib);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&filesTo,
                   &toSOName);
        std::__cxx11::string::~string((string *)&toSOName);
      }
      std::__cxx11::string::~string((string *)&targetNameImportLib);
      std::__cxx11::string::~string((string *)&to1);
      std::__cxx11::string::~string((string *)&from1);
      local_260 = cmInstallType_STATIC_LIBRARY;
    }
    else {
      bVar1 = cmGeneratorTarget::IsFrameworkOnApple(this->Target);
      if (bVar1) {
        if (this->NamelinkMode != NamelinkModeNone) {
          __assert_fail("this->NamelinkMode == NamelinkModeNone",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmInstallTargetGenerator.cxx"
                        ,0xd6,
                        "virtual void cmInstallTargetGenerator::GenerateScriptForConfig(std::ostream &, const std::string &, Indent)"
                       );
        }
        std::__cxx11::string::append((char *)&literal_args);
        std::operator+(&from1,&fromDirConfig,&targetName);
        cmsys::SystemTools::GetFilenamePath(&to1,&from1);
        std::__cxx11::string::operator=((string *)&from1,(string *)&to1);
        std::__cxx11::string::~string((string *)&to1);
        std::operator+(&to1,&toDir,&targetNameReal);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&filesFrom,&from1);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&filesTo,&to1);
      }
      else {
        bVar1 = cmGeneratorTarget::IsCFBundleOnApple(this->Target);
        if (!bVar1) {
          std::operator+(&from1,&fromDirConfig,&targetName);
          std::operator+(&to1,&toDir,&targetName);
          targetNameImportLib._M_dataplus._M_p = (pointer)&targetNameImportLib.field_2;
          targetNameImportLib._M_string_length = 0;
          targetNameImportLib.field_2._M_local_buf[0] = '\0';
          toSOName._M_dataplus._M_p = (pointer)&toSOName.field_2;
          toSOName._M_string_length = 0;
          toSOName.field_2._M_local_buf[0] = '\0';
          bVar1 = std::operator!=(&targetNameSO,&targetName);
          if (bVar1) {
            std::operator+(&fromRealName,&fromDirConfig,&targetNameSO);
            std::__cxx11::string::operator=((string *)&targetNameImportLib,(string *)&fromRealName);
            std::__cxx11::string::~string((string *)&fromRealName);
            std::operator+(&fromRealName,&toDir,&targetNameSO);
            std::__cxx11::string::operator=((string *)&toSOName,(string *)&fromRealName);
            std::__cxx11::string::~string((string *)&fromRealName);
          }
          fromRealName._M_dataplus._M_p = (pointer)&fromRealName.field_2;
          fromRealName._M_string_length = 0;
          fromRealName.field_2._M_local_buf[0] = '\0';
          toRealName._M_dataplus._M_p = (pointer)&toRealName.field_2;
          toRealName._M_string_length = 0;
          toRealName.field_2._M_local_buf[0] = '\0';
          bVar2 = std::operator!=(&targetNameReal,&targetName);
          if ((bVar2) && (bVar2 = std::operator!=(&targetNameReal,&targetNameSO), bVar2)) {
            std::operator+(&local_50,&fromDirConfig,&targetNameReal);
            std::__cxx11::string::operator=((string *)&fromRealName,(string *)&local_50);
            std::__cxx11::string::~string((string *)&local_50);
            std::operator+(&local_50,&toDir,&targetNameReal);
            std::__cxx11::string::operator=((string *)&toRealName,(string *)&local_50);
            std::__cxx11::string::~string((string *)&local_50);
LAB_003e4437:
            if (this->NamelinkMode == NamelinkModeOnly) goto LAB_003e44be;
            if (fromRealName._M_string_length != 0) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&filesFrom,&fromRealName);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&filesTo,&toRealName);
            }
            if (targetNameImportLib._M_string_length != 0) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&filesFrom,&targetNameImportLib);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&filesTo,&toSOName);
            }
            if (this->NamelinkMode != NamelinkModeSkip) goto LAB_003e44be;
          }
          else {
            if (bVar1) goto LAB_003e4437;
            if (this->NamelinkMode == NamelinkModeOnly) goto LAB_003e44e2;
LAB_003e44be:
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&filesFrom,&from1);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&filesTo,&to1);
          }
LAB_003e44e2:
          std::__cxx11::string::~string((string *)&toRealName);
          std::__cxx11::string::~string((string *)&fromRealName);
          std::__cxx11::string::~string((string *)&toSOName);
          std::__cxx11::string::~string((string *)&targetNameImportLib);
          std::__cxx11::string::~string((string *)&to1);
          goto LAB_003e451d;
        }
        std::__cxx11::string::append((char *)&literal_args);
        std::__cxx11::string::find((char)&targetName,0x2f);
        std::__cxx11::string::substr((ulong)&from1,(ulong)&targetName);
        std::operator+(&to1,&fromDirConfig,&from1);
        std::operator+(&targetNameImportLib,&toDir,&targetName);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&filesFrom,&to1);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&filesTo,&targetNameImportLib);
        std::__cxx11::string::~string((string *)&targetNameImportLib);
      }
      std::__cxx11::string::~string((string *)&to1);
      std::__cxx11::string::~string((string *)&from1);
      local_260 = cmInstallType_DIRECTORY;
    }
LAB_003e4527:
    std::__cxx11::string::~string((string *)&targetNamePDB);
  }
  std::__cxx11::string::~string((string *)&targetNameImport);
  std::__cxx11::string::~string((string *)&targetNameReal);
  std::__cxx11::string::~string((string *)&targetNameSO);
  std::__cxx11::string::~string((string *)&targetName);
  if ((long)filesFrom.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)filesFrom.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
      (long)filesTo.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)filesTo.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
    __assert_fail("filesFrom.size() == filesTo.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmInstallTargetGenerator.cxx"
                  ,0x12f,
                  "virtual void cmInstallTargetGenerator::GenerateScriptForConfig(std::ostream &, const std::string &, Indent)"
                 );
  }
  if (filesFrom.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      filesFrom.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    targetName._M_dataplus._M_p = (pointer)PreReplacementTweaks;
    targetName._M_string_length = 0;
    AddTweak(this,os,indent,config,&filesTo,(TweakMethod)pdbName);
    bVar1 = this->ImportLibrary;
    bVar2 = this->Optional;
    GetDestination(&targetName,this,config);
    uVar6 = (byte)(bVar2 | bVar1) & 1;
    tweak = (TweakMethod)uVar6;
    cmInstallGenerator::AddInstallRule
              (&this->super_cmInstallGenerator,os,&targetName,local_260,&filesFrom,SUB41(uVar6,0),
               (this->FilePermissions)._M_dataplus._M_p,(char *)0x0,(char *)0x0,
               literal_args._M_dataplus._M_p,indent);
    std::__cxx11::string::~string((string *)&targetName);
    targetName._M_dataplus._M_p = (pointer)PostReplacementTweaks;
    targetName._M_string_length = 0;
    AddTweak(this,os,indent,config,&filesTo,tweak);
  }
  std::__cxx11::string::~string((string *)&literal_args);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&filesTo);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&filesFrom);
  std::__cxx11::string::~string((string *)&toDir);
LAB_003e46cb:
  std::__cxx11::string::~string((string *)&fromDirConfig);
  return;
}

Assistant:

void cmInstallTargetGenerator::GenerateScriptForConfig(
  std::ostream& os, const std::string& config, Indent indent)
{
  cmStateEnums::TargetType targetType = this->Target->GetType();
  cmInstallType type = cmInstallType();
  switch (targetType) {
    case cmStateEnums::EXECUTABLE:
      type = cmInstallType_EXECUTABLE;
      break;
    case cmStateEnums::STATIC_LIBRARY:
      type = cmInstallType_STATIC_LIBRARY;
      break;
    case cmStateEnums::SHARED_LIBRARY:
      type = cmInstallType_SHARED_LIBRARY;
      break;
    case cmStateEnums::MODULE_LIBRARY:
      type = cmInstallType_MODULE_LIBRARY;
      break;
    case cmStateEnums::INTERFACE_LIBRARY:
      // Not reachable. We never create a cmInstallTargetGenerator for
      // an INTERFACE_LIBRARY.
      assert(false &&
             "INTERFACE_LIBRARY targets have no installable outputs.");
      break;

    case cmStateEnums::OBJECT_LIBRARY:
      this->GenerateScriptForConfigObjectLibrary(os, config, indent);
      return;

    case cmStateEnums::UTILITY:
    case cmStateEnums::GLOBAL_TARGET:
    case cmStateEnums::UNKNOWN_LIBRARY:
      this->Target->GetLocalGenerator()->IssueMessage(
        cmake::INTERNAL_ERROR,
        "cmInstallTargetGenerator created with non-installable target.");
      return;
  }

  // Compute the build tree directory from which to copy the target.
  std::string fromDirConfig;
  if (this->Target->NeedRelinkBeforeInstall(config)) {
    fromDirConfig =
      this->Target->GetLocalGenerator()->GetCurrentBinaryDirectory();
    fromDirConfig += cmake::GetCMakeFilesDirectory();
    fromDirConfig += "/CMakeRelink.dir/";
  } else {
    cmStateEnums::ArtifactType artifact = this->ImportLibrary
      ? cmStateEnums::ImportLibraryArtifact
      : cmStateEnums::RuntimeBinaryArtifact;
    fromDirConfig = this->Target->GetDirectory(config, artifact);
    fromDirConfig += "/";
  }

  std::string toDir =
    this->ConvertToAbsoluteDestination(this->GetDestination(config));
  toDir += "/";

  // Compute the list of files to install for this target.
  std::vector<std::string> filesFrom;
  std::vector<std::string> filesTo;
  std::string literal_args;

  if (targetType == cmStateEnums::EXECUTABLE) {
    // There is a bug in cmInstallCommand if this fails.
    assert(this->NamelinkMode == NamelinkModeNone);

    std::string targetName;
    std::string targetNameReal;
    std::string targetNameImport;
    std::string targetNamePDB;
    this->Target->GetExecutableNames(targetName, targetNameReal,
                                     targetNameImport, targetNamePDB, config);
    if (this->ImportLibrary) {
      std::string from1 = fromDirConfig + targetNameImport;
      std::string to1 = toDir + targetNameImport;
      filesFrom.push_back(from1);
      filesTo.push_back(to1);
      std::string targetNameImportLib;
      if (this->Target->GetImplibGNUtoMS(targetNameImport,
                                         targetNameImportLib)) {
        filesFrom.push_back(fromDirConfig + targetNameImportLib);
        filesTo.push_back(toDir + targetNameImportLib);
      }

      // An import library looks like a static library.
      type = cmInstallType_STATIC_LIBRARY;
    } else {
      std::string from1 = fromDirConfig + targetName;
      std::string to1 = toDir + targetName;

      // Handle OSX Bundles.
      if (this->Target->IsAppBundleOnApple()) {
        cmMakefile const* mf = this->Target->Target->GetMakefile();

        // Get App Bundle Extension
        const char* ext = this->Target->GetProperty("BUNDLE_EXTENSION");
        if (!ext) {
          ext = "app";
        }

        // Install the whole app bundle directory.
        type = cmInstallType_DIRECTORY;
        literal_args += " USE_SOURCE_PERMISSIONS";
        from1 += ".";
        from1 += ext;

        // Tweaks apply to the binary inside the bundle.
        to1 += ".";
        to1 += ext;
        to1 += "/";
        if (!mf->PlatformIsAppleIos()) {
          to1 += "Contents/MacOS/";
        }
        to1 += targetName;
      } else {
        // Tweaks apply to the real file, so list it first.
        if (targetNameReal != targetName) {
          std::string from2 = fromDirConfig + targetNameReal;
          std::string to2 = toDir += targetNameReal;
          filesFrom.push_back(from2);
          filesTo.push_back(to2);
        }
      }

      filesFrom.push_back(from1);
      filesTo.push_back(to1);
    }
  } else {
    std::string targetName;
    std::string targetNameSO;
    std::string targetNameReal;
    std::string targetNameImport;
    std::string targetNamePDB;
    this->Target->GetLibraryNames(targetName, targetNameSO, targetNameReal,
                                  targetNameImport, targetNamePDB, config);
    if (this->ImportLibrary) {
      // There is a bug in cmInstallCommand if this fails.
      assert(this->NamelinkMode == NamelinkModeNone);

      std::string from1 = fromDirConfig + targetNameImport;
      std::string to1 = toDir + targetNameImport;
      filesFrom.push_back(from1);
      filesTo.push_back(to1);
      std::string targetNameImportLib;
      if (this->Target->GetImplibGNUtoMS(targetNameImport,
                                         targetNameImportLib)) {
        filesFrom.push_back(fromDirConfig + targetNameImportLib);
        filesTo.push_back(toDir + targetNameImportLib);
      }

      // An import library looks like a static library.
      type = cmInstallType_STATIC_LIBRARY;
    } else if (this->Target->IsFrameworkOnApple()) {
      // There is a bug in cmInstallCommand if this fails.
      assert(this->NamelinkMode == NamelinkModeNone);

      // Install the whole framework directory.
      type = cmInstallType_DIRECTORY;
      literal_args += " USE_SOURCE_PERMISSIONS";

      std::string from1 = fromDirConfig + targetName;
      from1 = cmSystemTools::GetFilenamePath(from1);

      // Tweaks apply to the binary inside the bundle.
      std::string to1 = toDir + targetNameReal;

      filesFrom.push_back(from1);
      filesTo.push_back(to1);
    } else if (this->Target->IsCFBundleOnApple()) {
      // Install the whole app bundle directory.
      type = cmInstallType_DIRECTORY;
      literal_args += " USE_SOURCE_PERMISSIONS";

      std::string targetNameBase = targetName.substr(0, targetName.find('/'));

      std::string from1 = fromDirConfig + targetNameBase;
      std::string to1 = toDir + targetName;

      filesFrom.push_back(from1);
      filesTo.push_back(to1);
    } else {
      bool haveNamelink = false;

      // Library link name.
      std::string fromName = fromDirConfig + targetName;
      std::string toName = toDir + targetName;

      // Library interface name.
      std::string fromSOName;
      std::string toSOName;
      if (targetNameSO != targetName) {
        haveNamelink = true;
        fromSOName = fromDirConfig + targetNameSO;
        toSOName = toDir + targetNameSO;
      }

      // Library implementation name.
      std::string fromRealName;
      std::string toRealName;
      if (targetNameReal != targetName && targetNameReal != targetNameSO) {
        haveNamelink = true;
        fromRealName = fromDirConfig + targetNameReal;
        toRealName = toDir + targetNameReal;
      }

      // Add the names based on the current namelink mode.
      if (haveNamelink) {
        // With a namelink we need to check the mode.
        if (this->NamelinkMode == NamelinkModeOnly) {
          // Install the namelink only.
          filesFrom.push_back(fromName);
          filesTo.push_back(toName);
        } else {
          // Install the real file if it has its own name.
          if (!fromRealName.empty()) {
            filesFrom.push_back(fromRealName);
            filesTo.push_back(toRealName);
          }

          // Install the soname link if it has its own name.
          if (!fromSOName.empty()) {
            filesFrom.push_back(fromSOName);
            filesTo.push_back(toSOName);
          }

          // Install the namelink if it is not to be skipped.
          if (this->NamelinkMode != NamelinkModeSkip) {
            filesFrom.push_back(fromName);
            filesTo.push_back(toName);
          }
        }
      } else {
        // Without a namelink there will be only one file.  Install it
        // if this is not a namelink-only rule.
        if (this->NamelinkMode != NamelinkModeOnly) {
          filesFrom.push_back(fromName);
          filesTo.push_back(toName);
        }
      }
    }
  }

  // If this fails the above code is buggy.
  assert(filesFrom.size() == filesTo.size());

  // Skip this rule if no files are to be installed for the target.
  if (filesFrom.empty()) {
    return;
  }

  // Add pre-installation tweaks.
  this->AddTweak(os, indent, config, filesTo,
                 &cmInstallTargetGenerator::PreReplacementTweaks);

  // Write code to install the target file.
  const char* no_dir_permissions = CM_NULLPTR;
  const char* no_rename = CM_NULLPTR;
  bool optional = this->Optional || this->ImportLibrary;
  this->AddInstallRule(os, this->GetDestination(config), type, filesFrom,
                       optional, this->FilePermissions.c_str(),
                       no_dir_permissions, no_rename, literal_args.c_str(),
                       indent);

  // Add post-installation tweaks.
  this->AddTweak(os, indent, config, filesTo,
                 &cmInstallTargetGenerator::PostReplacementTweaks);
}